

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O2

void __thiscall psy::C::SemanticModelTester::case0353(SemanticModelTester *this)

{
  _func_int **pp_Var1;
  MemberDeclarationSymbol *pMVar2;
  bool bVar3;
  TypeKind TVar4;
  BasicTypeKind BVar5;
  int iVar6;
  FieldDeclarationSyntax *pFVar7;
  Lexeme *pLVar8;
  Type *pTVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined8 uVar10;
  ostream *poVar11;
  undefined4 extraout_var_04;
  ostream *poVar12;
  allocator<char> local_89;
  string local_88;
  vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  fldDeclSyms1;
  vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  fldDeclSyms0;
  SemanticModel *local_30;
  TestSuite *local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"struct x { int y , z ; double * k, w ; } ;",
             (allocator<char> *)&fldDeclSyms1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&fldDeclSyms0,"",&local_89);
  compile<psy::C::StructOrUnionDeclarationSyntax>
            ((SemanticModelTester *)&stack0xffffffffffffffd0,(string *)this,&local_88);
  std::__cxx11::string::~string((string *)&fldDeclSyms0);
  std::__cxx11::string::~string((string *)&local_88);
  pp_Var1 = local_28[5]._vptr_TestSuite;
  pFVar7 = (FieldDeclarationSyntax *)(**(code **)(**(long **)(pp_Var1[7] + 8) + 0xe0))();
  SemanticModel::fieldsFor(&fldDeclSyms0,local_30,pFVar7);
  if ((long)fldDeclSyms0.
            super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)fldDeclSyms0.
            super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x10) {
    poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
    poVar11 = std::operator<<(poVar11,"\n");
    poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,2);
    poVar11 = std::operator<<(poVar11,"\n");
    poVar11 = std::operator<<(poVar11,"\t\t");
    poVar11 = std::operator<<(poVar11,
                              "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                             );
    poVar11 = std::operator<<(poVar11,":");
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0x291);
    std::endl<char,std::char_traits<char>>(poVar11);
    uVar10 = __cxa_allocate_exception(1);
    __cxa_throw(uVar10,&TestFailed::typeinfo,0);
  }
  pMVar2 = &(*fldDeclSyms0.
              super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->super_MemberDeclarationSymbol;
  if (pMVar2 == (MemberDeclarationSymbol *)0x0) {
    poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar11 = std::operator<<(poVar11,"\t\tExpression is NOT ");
    poVar11 = std::operator<<(poVar11,"true");
    poVar11 = std::operator<<(poVar11,"\n");
    poVar11 = std::operator<<(poVar11,"\t\t");
    poVar11 = std::operator<<(poVar11,
                              "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                             );
    poVar12 = (ostream *)std::operator<<(poVar11,":");
    iVar6 = 0x294;
  }
  else {
    pLVar8 = &MemberDeclarationSymbol::name(pMVar2)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_88,pLVar8);
    bVar3 = std::operator==(&local_88,"y");
    std::__cxx11::string::~string((string *)&local_88);
    if (!bVar3) {
      poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
      pLVar8 = &MemberDeclarationSymbol::name(pMVar2)->super_Lexeme;
      Lexeme::valueText_abi_cxx11_(&local_88,pLVar8);
      poVar11 = std::operator<<(poVar11,(string *)&local_88);
      poVar11 = std::operator<<(poVar11,"\n");
      poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
      poVar11 = std::operator<<(poVar11,"y");
      poVar11 = std::operator<<(poVar11,"\n");
      poVar11 = std::operator<<(poVar11,"\t\t");
      poVar11 = std::operator<<(poVar11,
                                "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                               );
      poVar11 = std::operator<<(poVar11,":");
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0x295);
      std::endl<char,std::char_traits<char>>(poVar11);
      std::__cxx11::string::~string((string *)&local_88);
      goto LAB_0038ef0c;
    }
    pTVar9 = MemberDeclarationSymbol::type(pMVar2);
    TVar4 = Type::kind(pTVar9);
    if (TVar4 == Basic) {
      pTVar9 = MemberDeclarationSymbol::type(pMVar2);
      iVar6 = (*pTVar9->_vptr_Type[5])(pTVar9);
      BVar5 = BasicType::kind((BasicType *)CONCAT44(extraout_var,iVar6));
      if (BVar5 == Int_S) {
        pMVar2 = &fldDeclSyms0.
                  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[1]->super_MemberDeclarationSymbol;
        pLVar8 = &MemberDeclarationSymbol::name(pMVar2)->super_Lexeme;
        Lexeme::valueText_abi_cxx11_(&local_88,pLVar8);
        bVar3 = std::operator==(&local_88,"z");
        std::__cxx11::string::~string((string *)&local_88);
        if (bVar3) {
          pTVar9 = MemberDeclarationSymbol::type(pMVar2);
          TVar4 = Type::kind(pTVar9);
          if (TVar4 == Basic) {
            pTVar9 = MemberDeclarationSymbol::type(pMVar2);
            iVar6 = (*pTVar9->_vptr_Type[5])(pTVar9);
            BVar5 = BasicType::kind((BasicType *)CONCAT44(extraout_var_00,iVar6));
            if (BVar5 == Int_S) {
              pFVar7 = (FieldDeclarationSyntax *)
                       (**(code **)(**(long **)(*(long *)(pp_Var1[7] + 0x10) + 8) + 0xe0))();
              SemanticModel::fieldsFor(&fldDeclSyms1,local_30,pFVar7);
              if ((long)fldDeclSyms1.
                        super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)fldDeclSyms1.
                        super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                        ._M_impl.super__Vector_impl_data._M_start != 0x10) {
                poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
                poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
                poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
                poVar11 = std::operator<<(poVar11,"\n");
                poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
                poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,2);
                poVar11 = std::operator<<(poVar11,"\n");
                poVar11 = std::operator<<(poVar11,"\t\t");
                poVar11 = std::operator<<(poVar11,
                                          "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                         );
                poVar11 = std::operator<<(poVar11,":");
                poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0x2a0);
                std::endl<char,std::char_traits<char>>(poVar11);
                uVar10 = __cxa_allocate_exception(1);
                __cxa_throw(uVar10,&TestFailed::typeinfo,0);
              }
              pMVar2 = &(*fldDeclSyms1.
                          super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_MemberDeclarationSymbol;
              if (pMVar2 == (MemberDeclarationSymbol *)0x0) {
                poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
                poVar11 = std::operator<<(poVar11,"\t\tExpression is NOT ");
                poVar11 = std::operator<<(poVar11,"true");
                poVar11 = std::operator<<(poVar11,"\n");
                poVar11 = std::operator<<(poVar11,"\t\t");
                poVar11 = std::operator<<(poVar11,
                                          "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                         );
                poVar12 = (ostream *)std::operator<<(poVar11,":");
                iVar6 = 0x2a3;
              }
              else {
                pLVar8 = &MemberDeclarationSymbol::name(pMVar2)->super_Lexeme;
                Lexeme::valueText_abi_cxx11_(&local_88,pLVar8);
                bVar3 = std::operator==(&local_88,"k");
                std::__cxx11::string::~string((string *)&local_88);
                if (!bVar3) {
                  poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
                  poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
                  pLVar8 = &MemberDeclarationSymbol::name(pMVar2)->super_Lexeme;
                  Lexeme::valueText_abi_cxx11_(&local_88,pLVar8);
                  poVar11 = std::operator<<(poVar11,(string *)&local_88);
                  poVar11 = std::operator<<(poVar11,"\n");
                  poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
                  poVar11 = std::operator<<(poVar11,"k");
                  poVar11 = std::operator<<(poVar11,"\n");
                  poVar11 = std::operator<<(poVar11,"\t\t");
                  poVar11 = std::operator<<(poVar11,
                                            "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                           );
                  poVar11 = std::operator<<(poVar11,":");
                  poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0x2a4);
                  std::endl<char,std::char_traits<char>>(poVar11);
                  std::__cxx11::string::~string((string *)&local_88);
                  goto LAB_0038f51c;
                }
                pTVar9 = MemberDeclarationSymbol::type(pMVar2);
                TVar4 = Type::kind(pTVar9);
                if (TVar4 == Pointer) {
                  pMVar2 = &fldDeclSyms1.
                            super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]->
                            super_MemberDeclarationSymbol;
                  if (pMVar2 == (MemberDeclarationSymbol *)0x0) {
                    poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
                    poVar11 = std::operator<<(poVar11,"\t\tExpression is NOT ");
                    poVar11 = std::operator<<(poVar11,"true");
                    poVar11 = std::operator<<(poVar11,"\n");
                    poVar11 = std::operator<<(poVar11,"\t\t");
                    poVar11 = std::operator<<(poVar11,
                                              "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                             );
                    poVar12 = (ostream *)std::operator<<(poVar11,":");
                    iVar6 = 0x2a8;
                  }
                  else {
                    pLVar8 = &MemberDeclarationSymbol::name(pMVar2)->super_Lexeme;
                    Lexeme::valueText_abi_cxx11_(&local_88,pLVar8);
                    bVar3 = std::operator==(&local_88,"w");
                    std::__cxx11::string::~string((string *)&local_88);
                    if (!bVar3) {
                      poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
                      poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
                      pLVar8 = &MemberDeclarationSymbol::name(pMVar2)->super_Lexeme;
                      Lexeme::valueText_abi_cxx11_(&local_88,pLVar8);
                      poVar11 = std::operator<<(poVar11,(string *)&local_88);
                      poVar11 = std::operator<<(poVar11,"\n");
                      poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
                      poVar11 = std::operator<<(poVar11,"w");
                      poVar11 = std::operator<<(poVar11,"\n");
                      poVar11 = std::operator<<(poVar11,"\t\t");
                      poVar11 = std::operator<<(poVar11,
                                                "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                               );
                      poVar11 = std::operator<<(poVar11,":");
                      poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0x2a9);
                      std::endl<char,std::char_traits<char>>(poVar11);
                      std::__cxx11::string::~string((string *)&local_88);
                      goto LAB_0038f73e;
                    }
                    pTVar9 = MemberDeclarationSymbol::type(pMVar2);
                    TVar4 = Type::kind(pTVar9);
                    if (TVar4 == Basic) {
                      pTVar9 = MemberDeclarationSymbol::type(pMVar2);
                      iVar6 = (*pTVar9->_vptr_Type[5])(pTVar9);
                      BVar5 = BasicType::kind((BasicType *)CONCAT44(extraout_var_01,iVar6));
                      if (BVar5 == Double) {
                        std::
                        _Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                        ::~_Vector_base(&fldDeclSyms1.
                                         super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                                       );
                        std::
                        _Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                        ::~_Vector_base(&fldDeclSyms0.
                                         super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                                       );
                        return;
                      }
                      poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
                      poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
                      pTVar9 = MemberDeclarationSymbol::type(pMVar2);
                      iVar6 = (*pTVar9->_vptr_Type[5])(pTVar9);
                      BVar5 = BasicType::kind((BasicType *)CONCAT44(extraout_var_04,iVar6));
                      poVar11 = C::operator<<(poVar11,BVar5);
                      poVar11 = std::operator<<(poVar11,"\n");
                      poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
                      poVar11 = std::operator<<(poVar11,"double");
                      poVar11 = std::operator<<(poVar11,"\n");
                      poVar11 = std::operator<<(poVar11,"\t\t");
                      poVar11 = std::operator<<(poVar11,
                                                "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                               );
                      poVar12 = (ostream *)std::operator<<(poVar11,":");
                      iVar6 = 0x2ab;
                    }
                    else {
                      poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
                      poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
                      pTVar9 = MemberDeclarationSymbol::type(pMVar2);
                      TVar4 = Type::kind(pTVar9);
                      poVar11 = ::operator<<(poVar11,TVar4);
                      poVar11 = std::operator<<(poVar11,"\n");
                      poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
                      poVar11 = std::operator<<(poVar11,"Basic");
                      poVar11 = std::operator<<(poVar11,"\n");
                      poVar11 = std::operator<<(poVar11,"\t\t");
                      poVar11 = std::operator<<(poVar11,
                                                "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                               );
                      poVar12 = (ostream *)std::operator<<(poVar11,":");
                      iVar6 = 0x2aa;
                    }
                  }
                  poVar11 = (ostream *)std::ostream::operator<<(poVar12,iVar6);
                  std::endl<char,std::char_traits<char>>(poVar11);
LAB_0038f73e:
                  uVar10 = __cxa_allocate_exception(1);
                  __cxa_throw(uVar10,&TestFailed::typeinfo,0);
                }
                poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
                poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
                pTVar9 = MemberDeclarationSymbol::type(pMVar2);
                TVar4 = Type::kind(pTVar9);
                poVar11 = ::operator<<(poVar11,TVar4);
                poVar11 = std::operator<<(poVar11,"\n");
                poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
                poVar11 = std::operator<<(poVar11,"Pointer");
                poVar11 = std::operator<<(poVar11,"\n");
                poVar11 = std::operator<<(poVar11,"\t\t");
                poVar11 = std::operator<<(poVar11,
                                          "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                         );
                poVar12 = (ostream *)std::operator<<(poVar11,":");
                iVar6 = 0x2a5;
              }
              poVar11 = (ostream *)std::ostream::operator<<(poVar12,iVar6);
              std::endl<char,std::char_traits<char>>(poVar11);
LAB_0038f51c:
              uVar10 = __cxa_allocate_exception(1);
              __cxa_throw(uVar10,&TestFailed::typeinfo,0);
            }
            poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
            poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
            pTVar9 = MemberDeclarationSymbol::type(pMVar2);
            iVar6 = (*pTVar9->_vptr_Type[5])(pTVar9);
            BVar5 = BasicType::kind((BasicType *)CONCAT44(extraout_var_03,iVar6));
            poVar11 = C::operator<<(poVar11,BVar5);
            poVar11 = std::operator<<(poVar11,"\n");
            poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
            poVar11 = std::operator<<(poVar11,"signed int");
            poVar11 = std::operator<<(poVar11,"\n");
            poVar11 = std::operator<<(poVar11,"\t\t");
            poVar11 = std::operator<<(poVar11,
                                      "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                     );
            poVar12 = (ostream *)std::operator<<(poVar11,":");
            iVar6 = 0x29c;
          }
          else {
            poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
            poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
            pTVar9 = MemberDeclarationSymbol::type(pMVar2);
            TVar4 = Type::kind(pTVar9);
            poVar11 = ::operator<<(poVar11,TVar4);
            poVar11 = std::operator<<(poVar11,"\n");
            poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
            poVar11 = std::operator<<(poVar11,"Basic");
            poVar11 = std::operator<<(poVar11,"\n");
            poVar11 = std::operator<<(poVar11,"\t\t");
            poVar11 = std::operator<<(poVar11,
                                      "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                     );
            poVar12 = (ostream *)std::operator<<(poVar11,":");
            iVar6 = 0x29b;
          }
          poVar11 = (ostream *)std::ostream::operator<<(poVar12,iVar6);
          std::endl<char,std::char_traits<char>>(poVar11);
        }
        else {
          poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
          pLVar8 = &MemberDeclarationSymbol::name(pMVar2)->super_Lexeme;
          Lexeme::valueText_abi_cxx11_(&local_88,pLVar8);
          poVar11 = std::operator<<(poVar11,(string *)&local_88);
          poVar11 = std::operator<<(poVar11,"\n");
          poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
          poVar11 = std::operator<<(poVar11,"z");
          poVar11 = std::operator<<(poVar11,"\n");
          poVar11 = std::operator<<(poVar11,"\t\t");
          poVar11 = std::operator<<(poVar11,
                                    "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                                   );
          poVar11 = std::operator<<(poVar11,":");
          poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0x29a);
          std::endl<char,std::char_traits<char>>(poVar11);
          std::__cxx11::string::~string((string *)&local_88);
        }
        uVar10 = __cxa_allocate_exception(1);
        __cxa_throw(uVar10,&TestFailed::typeinfo,0);
      }
      poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
      pTVar9 = MemberDeclarationSymbol::type(pMVar2);
      iVar6 = (*pTVar9->_vptr_Type[5])(pTVar9);
      BVar5 = BasicType::kind((BasicType *)CONCAT44(extraout_var_02,iVar6));
      poVar11 = C::operator<<(poVar11,BVar5);
      poVar11 = std::operator<<(poVar11,"\n");
      poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
      poVar11 = std::operator<<(poVar11,"signed int");
      poVar11 = std::operator<<(poVar11,"\n");
      poVar11 = std::operator<<(poVar11,"\t\t");
      poVar11 = std::operator<<(poVar11,
                                "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                               );
      poVar12 = (ostream *)std::operator<<(poVar11,":");
      iVar6 = 0x297;
    }
    else {
      poVar11 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar11 = std::operator<<(poVar11,"\t\tActual  : ");
      pTVar9 = MemberDeclarationSymbol::type(pMVar2);
      TVar4 = Type::kind(pTVar9);
      poVar11 = ::operator<<(poVar11,TVar4);
      poVar11 = std::operator<<(poVar11,"\n");
      poVar11 = std::operator<<(poVar11,"\t\tExpected: ");
      poVar11 = std::operator<<(poVar11,"Basic");
      poVar11 = std::operator<<(poVar11,"\n");
      poVar11 = std::operator<<(poVar11,"\t\t");
      poVar11 = std::operator<<(poVar11,
                                "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                               );
      poVar12 = (ostream *)std::operator<<(poVar11,":");
      iVar6 = 0x296;
    }
  }
  poVar11 = (ostream *)std::ostream::operator<<(poVar12,iVar6);
  std::endl<char,std::char_traits<char>>(poVar11);
LAB_0038ef0c:
  uVar10 = __cxa_allocate_exception(1);
  __cxa_throw(uVar10,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0353()
{
    auto [tyDeclNode, semaModel] =
            compile<StructOrUnionDeclarationSyntax>("struct x { int y , z ; double * k, w ; } ;");

    auto tySpec = tyDeclNode->typeSpecifier();

    auto fldDeclNode0 = tySpec->declarations()->value->asFieldDeclaration();
    std::vector<const FieldDeclarationSymbol*> fldDeclSyms0 = semaModel->fieldsFor(fldDeclNode0);
    PSY_EXPECT_EQ_INT(fldDeclSyms0.size(), 2);

    const FieldDeclarationSymbol* fldDeclSym0_0 = fldDeclSyms0[0];
    PSY_EXPECT_TRUE(fldDeclSym0_0);
    PSY_EXPECT_EQ_STR(fldDeclSym0_0->name()->valueText(), "y");
    PSY_EXPECT_EQ_ENU(fldDeclSym0_0->type()->kind(), TypeKind::Basic, TypeKind);
    PSY_EXPECT_EQ_ENU(fldDeclSym0_0->type()->asBasicType()->kind(), BasicTypeKind::Int_S, BasicTypeKind);

    const FieldDeclarationSymbol* fldDeclSym0_1 = fldDeclSyms0[1];
    PSY_EXPECT_EQ_STR(fldDeclSym0_1->name()->valueText(), "z");
    PSY_EXPECT_EQ_ENU(fldDeclSym0_1->type()->kind(), TypeKind::Basic, TypeKind);
    PSY_EXPECT_EQ_ENU(fldDeclSym0_1->type()->asBasicType()->kind(), BasicTypeKind::Int_S, BasicTypeKind);

    auto fldDeclNode1 = tySpec->declarations()->next->value->asFieldDeclaration();
    std::vector<const FieldDeclarationSymbol*> fldDeclSyms1 = semaModel->fieldsFor(fldDeclNode1);
    PSY_EXPECT_EQ_INT(fldDeclSyms1.size(), 2);

    const FieldDeclarationSymbol* fldDeclSym1_0 = fldDeclSyms1[0];
    PSY_EXPECT_TRUE(fldDeclSym1_0);
    PSY_EXPECT_EQ_STR(fldDeclSym1_0->name()->valueText(), "k");
    PSY_EXPECT_EQ_ENU(fldDeclSym1_0->type()->kind(), TypeKind::Pointer, TypeKind);

    const FieldDeclarationSymbol* fldDeclSym1_1 = fldDeclSyms1[1];
    PSY_EXPECT_TRUE(fldDeclSym1_1);
    PSY_EXPECT_EQ_STR(fldDeclSym1_1->name()->valueText(), "w");
    PSY_EXPECT_EQ_ENU(fldDeclSym1_1->type()->kind(), TypeKind::Basic, TypeKind);
    PSY_EXPECT_EQ_ENU(fldDeclSym1_1->type()->asBasicType()->kind(), BasicTypeKind::Double, BasicTypeKind);
}